

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O0

CURLcode glob_match_url(char **result,char *filename,URLGlob *glob)

{
  URLGlob *pUVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  void *pvVar5;
  char *newstr;
  unsigned_long i;
  URLPattern *pat;
  unsigned_long num;
  char *ptr;
  size_t stringlen;
  size_t appendlen;
  char *appendthis;
  char numbuf [18];
  char *local_38;
  size_t allocsize;
  char *target;
  URLGlob *glob_local;
  char *filename_local;
  char **result_local;
  
  appendlen = 0;
  stringlen = 0;
  ptr = (char *)0x0;
  *result = (char *)0x0;
  glob_local = (URLGlob *)filename;
  filename_local = (char *)result;
  sVar3 = strlen(filename);
  local_38 = (char *)(sVar3 + 1);
  allocsize = (size_t)malloc((size_t)local_38);
  if ((void *)allocsize == (void *)0x0) {
    result_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    while ((char)glob_local->pattern[0].type != 0) {
      if (((char)glob_local->pattern[0].type == 0x23) &&
         (iVar2 = Curl_isdigit((uint)*(byte *)((long)&glob_local->pattern[0].type + 1)),
         pUVar1 = glob_local, iVar2 != 0)) {
        uVar4 = strtoul((char *)((long)&glob_local->pattern[0].type + 1),(char **)&glob_local,10);
        i = 0;
        if (uVar4 < glob->size) {
          for (newstr = (char *)0x0; newstr < (char *)glob->size; newstr = newstr + 1) {
            if (glob->pattern[(long)newstr].globindex == (int)uVar4 + -1) {
              i = (unsigned_long)(glob->pattern + (long)newstr);
              break;
            }
          }
        }
        if (i == 0) {
          glob_local = (URLGlob *)((long)&pUVar1->pattern[0].type + 1);
          appendlen = (size_t)pUVar1;
          stringlen = 1;
        }
        else {
          iVar2 = *(int *)i;
          if (iVar2 == 1) {
            if (*(long *)(i + 8) != 0) {
              appendlen = *(size_t *)(*(long *)(i + 8) + (long)*(int *)(i + 0x14) * 8);
              stringlen = strlen(*(char **)(*(long *)(i + 8) + (long)*(int *)(i + 0x14) * 8));
            }
          }
          else if (iVar2 == 2) {
            appendthis._0_1_ = *(undefined1 *)(i + 10);
            appendthis._1_1_ = 0;
            appendlen = (size_t)&appendthis;
            stringlen = 1;
          }
          else {
            if (iVar2 != 3) {
              curl_mfprintf(_stderr,"internal error: invalid pattern type (%d)\n",*(undefined4 *)i);
              free((void *)allocsize);
              return CURLE_FAILED_INIT;
            }
            curl_msnprintf(&appendthis,0x12,"%0*lu",*(undefined4 *)(i + 0x18),
                           *(undefined8 *)(i + 0x20));
            appendlen = (size_t)&appendthis;
            stringlen = strlen((char *)&appendthis);
          }
        }
      }
      else {
        appendlen = (size_t)glob_local;
        stringlen = 1;
        glob_local = (URLGlob *)((long)&glob_local->pattern[0].type + 1);
      }
      pvVar5 = (void *)allocsize;
      if (local_38 <= ptr + stringlen) {
        local_38 = (char *)((long)(ptr + stringlen) * 2);
        pvVar5 = realloc((void *)allocsize,(size_t)(local_38 + 1));
        if (pvVar5 == (void *)0x0) {
          free((void *)allocsize);
          return CURLE_OUT_OF_MEMORY;
        }
      }
      allocsize = (size_t)pvVar5;
      memcpy(ptr + allocsize,(void *)appendlen,stringlen);
      ptr = ptr + stringlen;
    }
    ptr[allocsize] = '\0';
    *(size_t *)filename_local = allocsize;
    result_local._4_4_ = CURLE_OK;
  }
  return result_local._4_4_;
}

Assistant:

CURLcode glob_match_url(char **result, char *filename, URLGlob *glob)
{
  char *target;
  size_t allocsize;
  char numbuf[18];
  char *appendthis = NULL;
  size_t appendlen = 0;
  size_t stringlen = 0;

  *result = NULL;

  /* We cannot use the glob_buffer for storage here since the filename may
   * be longer than the URL we use. We allocate a good start size, then
   * we need to realloc in case of need.
   */
  allocsize = strlen(filename) + 1; /* make it at least one byte to store the
                                       trailing zero */
  target = malloc(allocsize);
  if(!target)
    return CURLE_OUT_OF_MEMORY;

  while(*filename) {
    if(*filename == '#' && ISDIGIT(filename[1])) {
      char *ptr = filename;
      unsigned long num = strtoul(&filename[1], &filename, 10);
      URLPattern *pat = NULL;

      if(num < glob->size) {
        unsigned long i;
        num--; /* make it zero based */
        /* find the correct glob entry */
        for(i = 0; i<glob->size; i++) {
          if(glob->pattern[i].globindex == (int)num) {
            pat = &glob->pattern[i];
            break;
          }
        }
      }

      if(pat) {
        switch(pat->type) {
        case UPTSet:
          if(pat->content.Set.elements) {
            appendthis = pat->content.Set.elements[pat->content.Set.ptr_s];
            appendlen =
              strlen(pat->content.Set.elements[pat->content.Set.ptr_s]);
          }
          break;
        case UPTCharRange:
          numbuf[0] = pat->content.CharRange.ptr_c;
          numbuf[1] = 0;
          appendthis = numbuf;
          appendlen = 1;
          break;
        case UPTNumRange:
          snprintf(numbuf, sizeof(numbuf), "%0*lu",
                   pat->content.NumRange.padlength,
                   pat->content.NumRange.ptr_n);
          appendthis = numbuf;
          appendlen = strlen(numbuf);
          break;
        default:
          fprintf(stderr, "internal error: invalid pattern type (%d)\n",
                  (int)pat->type);
          Curl_safefree(target);
          return CURLE_FAILED_INIT;
        }
      }
      else {
        /* #[num] out of range, use the #[num] in the output */
        filename = ptr;
        appendthis = filename++;
        appendlen = 1;
      }
    }
    else {
      appendthis = filename++;
      appendlen = 1;
    }
    if(appendlen + stringlen >= allocsize) {
      char *newstr;
      /* we append a single byte to allow for the trailing byte to be appended
         at the end of this function outside the while() loop */
      allocsize = (appendlen + stringlen) * 2;
      newstr = realloc(target, allocsize + 1);
      if(!newstr) {
        Curl_safefree(target);
        return CURLE_OUT_OF_MEMORY;
      }
      target = newstr;
    }
    memcpy(&target[stringlen], appendthis, appendlen);
    stringlen += appendlen;
  }
  target[stringlen]= '\0';

#if defined(MSDOS) || defined(WIN32)
  {
    char *sanitized;
    SANITIZEcode sc = sanitize_file_name(&sanitized, target,
                                         (SANITIZE_ALLOW_PATH |
                                          SANITIZE_ALLOW_RESERVED));
    Curl_safefree(target);
    if(sc)
      return CURLE_URL_MALFORMAT;
    target = sanitized;
  }
#endif /* MSDOS || WIN32 */

  *result = target;
  return CURLE_OK;
}